

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::AddUserItem
          (cmComputeLinkInformation *this,LinkEntry *entry,bool pathNotKnown)

{
  byte *pbVar1;
  bool bVar2;
  uint uVar3;
  const_iterator cVar4;
  string *this_00;
  string_view str;
  string_view str_00;
  string lib;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_100;
  ItemIsPath local_cc;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_c8;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_b8;
  string local_a8;
  string out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  pbVar1 = (byte *)(entry->Item).Value._M_dataplus._M_p;
  uVar3 = *pbVar1 - 0x24;
  if ((uVar3 < 0x3d) && ((0x1000000000000201U >> ((ulong)uVar3 & 0x3f) & 1) != 0)) {
    str._M_str = (char *)pbVar1;
    str._M_len = (entry->Item).Value._M_string_length;
    bVar2 = cmHasLiteralPrefix<3ul>(str,(char (*) [3])0x7cf465);
    if ((bVar2) ||
       (str_00._M_str = (entry->Item).Value._M_dataplus._M_p,
       str_00._M_len = (entry->Item).Value._M_string_length,
       bVar2 = cmHasLiteralPrefix<7ul>(str_00,(char (*) [7])"-Wl,-l"), bVar2)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->OldUserFlagItems,(value_type *)entry);
    }
    SetCurrentLinkType(this,this->StartLinkType);
    local_100.Value._M_dataplus._M_p._0_4_ = 0;
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<BT<std::__cxx11::string>const&,cmComputeLinkInformation::ItemIsPath>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,&entry->Item,(ItemIsPath *)&local_100);
    return;
  }
  lib._M_dataplus._M_p = (pointer)&lib.field_2;
  lib._M_string_length = 0;
  lib.field_2._M_local_buf[0] = '\0';
  bVar2 = cmsys::RegularExpression::find(&this->ExtractSharedLibraryName,(string *)entry);
  if (bVar2) {
    SetCurrentLinkType(this,LinkShared);
    cmsys::RegularExpressionMatch::match_abi_cxx11_
              (&local_100.Value,&(this->ExtractSharedLibraryName).regmatch,2);
  }
  else {
    bVar2 = cmsys::RegularExpression::find(&this->ExtractStaticLibraryName,(string *)entry);
    if (bVar2) {
      SetCurrentLinkType(this,LinkStatic);
      cmsys::RegularExpressionMatch::match_abi_cxx11_
                (&local_100.Value,&(this->ExtractStaticLibraryName).regmatch,2);
    }
    else {
      bVar2 = cmsys::RegularExpression::find(&this->ExtractAnyLibraryName,(string *)entry);
      if (!bVar2) {
        if (pathNotKnown) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->OldUserFlagItems,(value_type *)entry);
        }
        SetCurrentLinkType(this,this->StartLinkType);
        std::__cxx11::string::_M_assign((string *)&lib);
        goto LAB_0047132a;
      }
      SetCurrentLinkType(this,this->StartLinkType);
      cmsys::RegularExpressionMatch::match_abi_cxx11_
                (&local_100.Value,&(this->ExtractAnyLibraryName).regmatch,2);
    }
  }
  std::__cxx11::string::operator=((string *)&lib,(string *)&local_100);
  std::__cxx11::string::~string((string *)&local_100);
LAB_0047132a:
  cmStrCat<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
            (&out,&this->LibLinkFlag,&lib,&this->LibLinkSuffix);
  bVar2 = std::operator!=(&entry->Feature,(anonymous_namespace)::DEFAULT_abi_cxx11_);
  if (bVar2) {
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
            ::find(&(this->LibraryFeatureDescriptors)._M_t,&entry->Feature);
    cmStrCat<std::__cxx11::string&,std::__cxx11::string&>(&local_a8,&lib,&this->LibLinkSuffix);
    FeatureDescriptor::GetDecoratedItem
              (&local_48,(FeatureDescriptor *)(cVar4._M_node + 2),&local_a8,(string *)entry,&out,No)
    ;
    std::
    __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_b8,
                   (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    *)&(entry->Item).Backtrace);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&local_100,&local_48,(cmListFileBacktrace *)&local_b8);
    local_cc = No;
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<BT<std::__cxx11::string>,cmComputeLinkInformation::ItemIsPath>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,&local_100,&local_cc);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&local_100);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
    std::__cxx11::string::~string((string *)&local_48);
    this_00 = &local_a8;
  }
  else {
    std::__cxx11::string::string((string *)&local_68,(string *)&out);
    std::
    __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_c8,
                   (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    *)&(entry->Item).Backtrace);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&local_100,&local_68,(cmListFileBacktrace *)&local_c8);
    local_a8._M_dataplus._M_p._0_4_ = 0;
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<BT<std::__cxx11::string>,cmComputeLinkInformation::ItemIsPath>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,&local_100,(ItemIsPath *)&local_a8);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&local_100);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
    this_00 = &local_68;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::~string((string *)&lib);
  return;
}

Assistant:

void cmComputeLinkInformation::AddUserItem(LinkEntry const& entry,
                                           bool pathNotKnown)
{
  // This is called to handle a link item that does not match a CMake
  // target and is not a full path.  We check here if it looks like a
  // library file name to automatically request the proper link type
  // from the linker.  For example:
  //
  //   foo       ==>  -lfoo
  //   libfoo.a  ==>  -Wl,-Bstatic -lfoo

  BT<std::string> const& item = entry.Item;

  if (item.Value[0] == '-' || item.Value[0] == '$' || item.Value[0] == '`') {
    // Pass flags through untouched.
    // if this is a -l option then we might need to warn about
    // CMP0003 so put it in OldUserFlagItems, if it is not a -l
    // or -Wl,-l (-framework -pthread), then allow it without a
    // CMP0003 as -L will not affect those other linker flags
    if (cmHasLiteralPrefix(item.Value, "-l") ||
        cmHasLiteralPrefix(item.Value, "-Wl,-l")) {
      // This is a linker option provided by the user.
      this->OldUserFlagItems.push_back(item.Value);
    }

    // Restore the target link type since this item does not specify
    // one.
    this->SetCurrentLinkType(this->StartLinkType);

    // Use the item verbatim.
    this->Items.emplace_back(item, ItemIsPath::No);
    return;
  }

  // Parse out the prefix, base, and suffix components of the
  // library name.  If the name matches that of a shared or static
  // library then set the link type accordingly.
  //
  // Search for shared library names first because some platforms
  // have shared libraries with names that match the static library
  // pattern.  For example cygwin and msys use the convention
  // libfoo.dll.a for import libraries and libfoo.a for static
  // libraries.  On AIX a library with the name libfoo.a can be
  // shared!
  std::string lib;
  if (this->ExtractSharedLibraryName.find(item.Value)) {
// This matches a shared library file name.
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
    fprintf(stderr, "shared regex matched [%s] [%s] [%s]\n",
            this->ExtractSharedLibraryName.match(1).c_str(),
            this->ExtractSharedLibraryName.match(2).c_str(),
            this->ExtractSharedLibraryName.match(3).c_str());
#endif
    // Set the link type to shared.
    this->SetCurrentLinkType(LinkShared);

    // Use just the library name so the linker will search.
    lib = this->ExtractSharedLibraryName.match(2);
  } else if (this->ExtractStaticLibraryName.find(item.Value)) {
// This matches a static library file name.
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
    fprintf(stderr, "static regex matched [%s] [%s] [%s]\n",
            this->ExtractStaticLibraryName.match(1).c_str(),
            this->ExtractStaticLibraryName.match(2).c_str(),
            this->ExtractStaticLibraryName.match(3).c_str());
#endif
    // Set the link type to static.
    this->SetCurrentLinkType(LinkStatic);

    // Use just the library name so the linker will search.
    lib = this->ExtractStaticLibraryName.match(2);
  } else if (this->ExtractAnyLibraryName.find(item.Value)) {
// This matches a library file name.
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
    fprintf(stderr, "any regex matched [%s] [%s] [%s]\n",
            this->ExtractAnyLibraryName.match(1).c_str(),
            this->ExtractAnyLibraryName.match(2).c_str(),
            this->ExtractAnyLibraryName.match(3).c_str());
#endif
    // Restore the target link type since this item does not specify
    // one.
    this->SetCurrentLinkType(this->StartLinkType);

    // Use just the library name so the linker will search.
    lib = this->ExtractAnyLibraryName.match(2);
  } else {
    // This is a name specified by the user.
    if (pathNotKnown) {
      this->OldUserFlagItems.push_back(item.Value);
    }

    // We must ask the linker to search for a library with this name.
    // Restore the target link type since this item does not specify
    // one.
    this->SetCurrentLinkType(this->StartLinkType);
    lib = item.Value;
  }

  // Create an option to ask the linker to search for the library.
  auto out = cmStrCat(this->LibLinkFlag, lib, this->LibLinkSuffix);

  if (entry.Feature != DEFAULT) {
    auto const& feature = this->GetLibraryFeature(entry.Feature);
    this->Items.emplace_back(
      BT<std::string>(
        feature.GetDecoratedItem(cmStrCat(lib, this->LibLinkSuffix),
                                 item.Value, out, ItemIsPath::No),
        item.Backtrace),
      ItemIsPath::No);
  } else {
    this->Items.emplace_back(BT<std::string>(out, item.Backtrace),
                             ItemIsPath::No);
  }

  // Here we could try to find the library the linker will find and
  // add a runtime information entry for it.  It would probably not be
  // reliable and we want to encourage use of full paths for library
  // specification.
}